

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status
fdb_switch_compaction_mode(fdb_file_handle *fhandle,fdb_compaction_mode_t mode,size_t new_threshold)

{
  fdb_compaction_mode_t fVar1;
  fdb_kvs_handle *handle;
  filemgr *pfVar2;
  bool bVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  fdb_config config;
  char vfilename [1024];
  char filename [1024];
  char metafile [1024];
  
  if (fhandle == (fdb_file_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  handle = fhandle->root;
  if (handle == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  if (100 < new_threshold) {
    return FDB_RESULT_INVALID_ARGS;
  }
  memcpy(&config,&handle->config,0xf8);
  if ((handle->config).compaction_mode == mode) {
    if (mode == '\x01') {
      compactor_change_threshold(handle->file,new_threshold);
    }
  }
  else {
    sVar6 = filemgr_get_ref_count(handle->file);
    if (1 < sVar6) {
      return FDB_RESULT_FILE_IS_BUSY;
    }
    fVar1 = (handle->config).compaction_mode;
    if (fVar1 == '\0') {
      pfVar2 = handle->file;
      strcpy(vfilename,pfVar2->filename);
      compactor_get_next_filename(pfVar2->filename,filename);
      fVar4 = _fdb_close(handle);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        return fVar4;
      }
      iVar5 = rename(vfilename,filename);
      if (iVar5 < 0) {
        return FDB_RESULT_FILE_RENAME_FAIL;
      }
      config.compaction_mode = '\x01';
      config.compaction_threshold = (uint8_t)new_threshold;
    }
    else {
      if (fVar1 != '\x01') {
        return FDB_RESULT_INVALID_ARGS;
      }
      bVar3 = compactor_switch_compaction_flag(handle->file,true);
      if (!bVar3) {
        return FDB_RESULT_FILE_IS_BUSY;
      }
      strcpy(vfilename,handle->filename);
      strcpy(filename,handle->file->filename);
      fVar4 = _fdb_close(handle);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        return fVar4;
      }
      sprintf(metafile,"%s.meta",vfilename);
      iVar5 = remove(metafile);
      if (iVar5 < 0) {
        return FDB_RESULT_FILE_REMOVE_FAIL;
      }
      iVar5 = rename(filename,vfilename);
      if (iVar5 < 0) {
        return FDB_RESULT_FILE_RENAME_FAIL;
      }
      config.compaction_mode = '\0';
    }
    fVar4 = _fdb_open(handle,vfilename,FDB_VFILENAME,&config);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      return fVar4;
    }
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

LIBFDB_API
fdb_status fdb_switch_compaction_mode(fdb_file_handle *fhandle,
                                      fdb_compaction_mode_t mode,
                                      size_t new_threshold)
{
    if (!fhandle || !fhandle->root) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    int ret;
    fdb_status fs;
    fdb_kvs_handle *handle = fhandle->root;
    fdb_config config;
    char vfilename[FDB_MAX_FILENAME_LEN];
    char filename[FDB_MAX_FILENAME_LEN];
    char metafile[FDB_MAX_FILENAME_LEN];

    if (new_threshold > 100) {
        return FDB_RESULT_INVALID_ARGS;
    }

    config = handle->config;
    if (handle->config.compaction_mode != mode) {
        if (filemgr_get_ref_count(handle->file) > 1) {
            // all the other handles referring this file should be closed
            return FDB_RESULT_FILE_IS_BUSY;
        }
        /* TODO: In current code, we assume that all the other handles referring
         * the same database file should be closed before calling this API and
         * any open API calls should not be made until the completion of this API.
         */

        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // 1. deregister from compactor (by calling fdb_close)
            // 2. remove [filename].meta
            // 3. rename [filename].[n] as [filename]

            // set compaction flag to avoid auto compaction.
            // we will not clear this flag again becuase this file will be
            // deregistered by calling _fdb_close().
            if (compactor_switch_compaction_flag(handle->file, true) == false) {
                return FDB_RESULT_FILE_IS_BUSY;
            }

            strcpy(vfilename, handle->filename);
            strcpy(filename, handle->file->filename);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            sprintf(metafile, "%s.meta", vfilename);
            if ((ret = remove(metafile)) < 0) {
                return FDB_RESULT_FILE_REMOVE_FAIL;
            }
            if ((ret = rename(filename, vfilename)) < 0) {
                return FDB_RESULT_FILE_RENAME_FAIL;
            }
            config.compaction_mode = FDB_COMPACTION_MANUAL;
            fs = _fdb_open(handle, vfilename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
        } else if (handle->config.compaction_mode == FDB_COMPACTION_MANUAL) {
            // 1. rename [filename] as [filename].rev_num
            strcpy(vfilename, handle->file->filename);
            compactor_get_next_filename(handle->file->filename, filename);
            fs = _fdb_close(handle);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }
            if ((ret = rename(vfilename, filename) < 0)) {
                return FDB_RESULT_FILE_RENAME_FAIL;
            }
            config.compaction_mode = FDB_COMPACTION_AUTO;
            config.compaction_threshold = new_threshold;
            fs = _fdb_open(handle, vfilename, FDB_VFILENAME, &config);
            if (fs != FDB_RESULT_SUCCESS) {
                return fs;
            }

        } else {
            return FDB_RESULT_INVALID_ARGS;
        }
    } else {
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // change compaction threshold of the existing file
            compactor_change_threshold(handle->file, new_threshold);
        }
    }
    return FDB_RESULT_SUCCESS;
}